

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm2dot.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar4;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar5;
  options_description *poVar6;
  basic_command_line_parser<char> *this;
  size_type sVar7;
  ostream *poVar8;
  any *paVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  string *psVar11;
  uint uVar12;
  allocator<char> local_7ba;
  allocator<char> local_7b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b8;
  path dot_file_path;
  path input_file_path;
  fsm_def sm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  path image_file_path;
  string local_6c8 [32];
  string local_6a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  string dot_cmd;
  positional_options_description p;
  string file_data;
  options_description hidden;
  options_description cmdline_options;
  options_description visible;
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_240 [144];
  options_description config_file_options;
  options_description config;
  options_description basic;
  
  boost::program_options::variables_map::variables_map(&vm);
  file_data._M_dataplus._M_p = (pointer)&file_data.field_2;
  file_data._M_string_length = 0;
  file_data.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dot_cmd,"Basic options",(allocator<char> *)&config);
  uVar1 = (uint)boost::program_options::options_description::m_default_line_length;
  uVar12 = (uint)boost::program_options::options_description::m_default_line_length >> 1;
  boost::program_options::options_description::options_description
            (&basic,(string *)&dot_cmd,
             (uint)boost::program_options::options_description::m_default_line_length,uVar12);
  std::__cxx11::string::~string((string *)&dot_cmd);
  dot_cmd._M_dataplus._M_p = (pointer)boost::program_options::options_description::add_options();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&dot_cmd,"version,v");
  boost::program_options::options_description_easy_init::operator()(pcVar3,"help,h");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dot_cmd,"Configuration",(allocator<char> *)&hidden);
  boost::program_options::options_description::options_description
            (&config,(string *)&dot_cmd,uVar1,uVar12);
  std::__cxx11::string::~string((string *)&dot_cmd);
  sm.transitions.super__Vector_base<transition,_std::allocator<transition>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)boost::program_options::options_description::add_options();
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  std::__cxx11::string::string<std::allocator<char>>((string *)&dot_cmd,"",(allocator<char> *)&p);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,&dot_cmd);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&sm,(value_semantic *)"file,f",(char *)ptVar4);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,"dot-stdout");
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hidden,"dot",(allocator<char> *)&input_file_path);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&hidden);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"dot-path,dot",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmdline_options,"",(allocator<char> *)&dot_file_path);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&cmdline_options);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"output-dir,dir",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&config_file_options,"",(allocator<char> *)&image_file_path);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&config_file_options);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"output,o",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&visible,"png",(allocator<char> *)&local_7b8);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&visible);
  boost::program_options::options_description_easy_init::operator()
            (pcVar3,(value_semantic *)"image-ext,ext",(char *)ptVar4);
  std::__cxx11::string::~string((string *)&visible);
  std::__cxx11::string::~string((string *)&config_file_options);
  std::__cxx11::string::~string((string *)&cmdline_options);
  std::__cxx11::string::~string((string *)&hidden);
  std::__cxx11::string::~string((string *)&dot_cmd);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dot_cmd,"Hidden options",(allocator<char> *)&cmdline_options);
  boost::program_options::options_description::options_description
            (&hidden,(string *)&dot_cmd,uVar1,uVar12);
  std::__cxx11::string::~string((string *)&dot_cmd);
  dot_cmd._M_dataplus._M_p = (pointer)boost::program_options::options_description::add_options();
  ptVar5 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  boost::program_options::options_description_easy_init::operator()
            ((char *)&dot_cmd,(value_semantic *)"dot-params",(char *)ptVar5);
  boost::program_options::options_description::options_description(&cmdline_options,uVar1,uVar12);
  poVar6 = (options_description *)boost::program_options::options_description::add(&cmdline_options)
  ;
  poVar6 = (options_description *)boost::program_options::options_description::add(poVar6);
  boost::program_options::options_description::add(poVar6);
  boost::program_options::options_description::options_description
            (&config_file_options,uVar1,uVar12);
  poVar6 = (options_description *)
           boost::program_options::options_description::add(&config_file_options);
  boost::program_options::options_description::add(poVar6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dot_cmd,"Allowed options",(allocator<char> *)&sm);
  boost::program_options::options_description::options_description
            (&visible,(string *)&dot_cmd,uVar1,uVar12);
  std::__cxx11::string::~string((string *)&dot_cmd);
  poVar6 = (options_description *)boost::program_options::options_description::add(&visible);
  boost::program_options::options_description::add(poVar6);
  boost::program_options::positional_options_description::positional_options_description(&p);
  boost::program_options::positional_options_description::add((char *)&p,0x11123f);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)&dot_cmd,argc,argv);
  this = boost::program_options::basic_command_line_parser<char>::options
                   ((basic_command_line_parser<char> *)&dot_cmd,&cmdline_options);
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)this);
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)&sm,this);
  boost::program_options::store((basic_parsed_options *)&sm,&vm,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&sm);
  boost::program_options::detail::cmdline::~cmdline((cmdline *)&dot_cmd);
  boost::program_options::notify(&vm);
  boost::program_options::notify(&vm);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dot_cmd,"help",(allocator<char> *)&sm);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_240,&dot_cmd);
  std::__cxx11::string::~string((string *)&dot_cmd);
  if (sVar7 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dot_cmd,"version",(allocator<char> *)&sm);
    sVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_240,&dot_cmd);
    std::__cxx11::string::~string((string *)&dot_cmd);
    if (sVar7 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dot_cmd,"dot-params",(allocator<char> *)&sm);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
      ::count(local_240,&dot_cmd);
      std::__cxx11::string::~string((string *)&dot_cmd);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dot_cmd,"file",(allocator<char> *)&sm);
      paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      pbVar10 = boost::any_cast<std::__cxx11::string_const&>(paVar9);
      std::__cxx11::string::string((string *)&input_file_path,(string *)pbVar10);
      std::__cxx11::string::~string((string *)&dot_cmd);
      fsm_from_file(&sm,&input_file_path);
      boost::filesystem::path::path((path *)&dot_cmd,"gv");
      psVar11 = (string *)boost::filesystem::path::replace_extension(&input_file_path);
      std::__cxx11::string::string((string *)&dot_file_path,psVar11);
      std::__cxx11::string::~string((string *)&dot_cmd);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7b8,"image-ext",(allocator<char> *)&local_708);
      paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      pbVar10 = boost::any_cast<std::__cxx11::string_const&>(paVar9);
      std::__cxx11::string::string((string *)&dot_cmd,(string *)pbVar10);
      psVar11 = (string *)boost::filesystem::path::replace_extension(&input_file_path);
      std::__cxx11::string::string((string *)&image_file_path,psVar11);
      std::__cxx11::string::~string((string *)&dot_cmd);
      std::__cxx11::string::~string((string *)&local_7b8);
      poVar8 = std::operator<<((ostream *)&std::cout,"Writing dot file to: \'");
      poVar8 = std::operator<<(poVar8,(string *)&dot_file_path);
      poVar8 = std::operator<<(poVar8,"\'");
      std::endl<char,std::char_traits<char>>(poVar8);
      std::ofstream::ofstream(&dot_cmd,(string *)&dot_file_path,_S_out);
      poVar8 = operator<<((ostream *)&dot_cmd,&sm);
      std::endl<char,std::char_traits<char>>(poVar8);
      std::ofstream::~ofstream(&dot_cmd);
      std::__cxx11::string::string<std::allocator<char>>(local_6a8,"dot-path",&local_7b9);
      paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      pbVar10 = boost::any_cast<std::__cxx11::string_const&>(paVar9);
      std::operator+(&local_688,pbVar10," -T");
      std::__cxx11::string::string<std::allocator<char>>(local_6c8,"image-ext",&local_7ba);
      paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      pbVar10 = boost::any_cast<std::__cxx11::string_const&>(paVar9);
      std::operator+(&local_668,&local_688,pbVar10);
      std::operator+(&local_648,&local_668," ");
      std::operator+(&local_708,&local_648,&dot_file_path.m_pathname);
      std::operator+(&local_7b8,&local_708," -o ");
      std::operator+(&dot_cmd,&local_7b8,&image_file_path.m_pathname);
      std::__cxx11::string::~string((string *)&local_7b8);
      std::__cxx11::string::~string((string *)&local_708);
      std::__cxx11::string::~string((string *)&local_648);
      std::__cxx11::string::~string((string *)&local_668);
      std::__cxx11::string::~string(local_6c8);
      std::__cxx11::string::~string((string *)&local_688);
      std::__cxx11::string::~string(local_6a8);
      poVar8 = std::operator<<((ostream *)&std::cout,"Running dot with following command:\n");
      poVar8 = std::operator<<(poVar8,(string *)&dot_cmd);
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar2 = system(dot_cmd._M_dataplus._M_p);
      if (iVar2 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7b8,"dot-stdout",(allocator<char> *)&local_708);
        sVar7 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::count(local_240,&local_7b8);
        std::__cxx11::string::~string((string *)&local_7b8);
        iVar2 = 0;
        if (sVar7 != 0) {
          poVar8 = operator<<((ostream *)&std::cout,&sm);
          std::endl<char,std::char_traits<char>>(poVar8);
        }
      }
      else {
        poVar8 = std::operator<<((ostream *)&std::cout,"Error when running dot!");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar2 = 1;
      }
      std::__cxx11::string::~string((string *)&dot_cmd);
      std::__cxx11::string::~string((string *)&image_file_path);
      std::__cxx11::string::~string((string *)&dot_file_path);
      fsm_def::~fsm_def(&sm);
      std::__cxx11::string::~string((string *)&input_file_path);
      goto LAB_001061d7;
    }
    poVar8 = std::operator<<((ostream *)&std::cout,"fsm2dot version 1.0");
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  else {
    poVar8 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,&visible);
    std::operator<<(poVar8,"\n");
  }
  iVar2 = 0;
LAB_001061d7:
  boost::program_options::positional_options_description::~positional_options_description(&p);
  boost::program_options::options_description::~options_description(&visible);
  boost::program_options::options_description::~options_description(&config_file_options);
  boost::program_options::options_description::~options_description(&cmdline_options);
  boost::program_options::options_description::~options_description(&hidden);
  boost::program_options::options_description::~options_description(&config);
  boost::program_options::options_description::~options_description(&basic);
  std::__cxx11::string::~string((string *)&file_data);
  boost::program_options::variables_map::~variables_map(&vm);
  return iVar2;
}

Assistant:

int main(int argc, const char *argv[])
{
    po::variables_map vm;
    using namespace std;

    std::string file_data;

    try {
        // Declare a group of options that will be allowed only on command line
        po::options_description basic("Basic options");
        basic.add_options()
                ("version,v",   "print version string")
                ("help,h",      "produce help message")
                ;

        // Declare a group of options that will be
        // allowed both on command line and in config file
        po::options_description config("Configuration");
        config.add_options()
                ("file,f", po::value<std::string>()->default_value(""), "C++ file with state machine definition")
                ("dot-stdout", "Write dot file also to stdout")
                ("dot-path,dot", po::value<std::string>()->default_value("dot"), "Full path (or name if in PATH) of the dot executable")
                ("output-dir,dir", po::value<std::string>()->default_value(""), "Output directory for dot and image file")
                ("output,o", po::value<std::string>()->default_value(""), "Output file name(s) for .dot file and image file")
                ("image-ext,ext", po::value<std::string>()->default_value("png"), "Image extension")
                ;

        // Hidden options, will be allowed both on command line and
        // in config file, but will not be shown to the user.
        // Hidden options are those without argument names (unanmed arguments).
        // In this case we use them for the php script to execute along
        // with the command line parameters for this script.
        po::options_description hidden("Hidden options");
        hidden.add_options()
                ("dot-params", po::value< std::vector<std::string> >(), "(Graphviz) dot parameters")
                ;


        po::options_description cmdline_options;
        cmdline_options.add(basic).add(config).add(hidden);

        po::options_description config_file_options;
        config_file_options.add(config).add(hidden);

        po::options_description visible("Allowed options");
        visible.add(basic).add(config);

        po::positional_options_description p;
        p.add("dot-params", -1);

        po::store(po::command_line_parser(argc, argv).options(cmdline_options).positional(p).run(), vm);
        po::notify(vm);

        notify(vm);

        if (vm.count("help")) {
            std::cout << visible << "\n";
            return 0;
        }

        if (vm.count("version")) {
            std::cout << "fsm2dot version 1.0" << std::endl;
            return 0;
        }

        // PHP miner script and parameters for this
        if (vm.count("dot-params")) {
        }

        auto input_file_path = boost::filesystem::path(vm["file"].as<std::string >());
        {
            fsm_def sm = fsm_from_file(input_file_path);

            const auto dot_file_path   = input_file_path.replace_extension("gv");
            const auto image_file_path = input_file_path.replace_extension(vm["image-ext"].as<std::string >());
            {
                std::cout << "Writing dot file to: '" << dot_file_path.native() << "'" << std::endl;
                std::ofstream os(dot_file_path.native());
                os << sm << std::endl;
            }
            std::string dot_cmd = vm["dot-path"].as<std::string >()
                    + " -T" + vm["image-ext"].as<std::string >()
                    + " " + dot_file_path.native()
                    + " -o " + image_file_path.native();

            std::cout << "Running dot with following command:\n" << dot_cmd << std::endl;
            // dot -Tpng fsm.gv -o myFiniteStateMachine.png

            if (std::system(dot_cmd.c_str()) != 0) {
                std::cout << "Error when running dot!" << std::endl;
                return 1;
            }
            if (vm.count("dot-stdout")) {
                std::cout << sm << std::endl;
            }
        }

    }
    catch(std::exception& e)
    {
        std::cout << "Error: Unknown arguments given:" << std::endl;
        std::cout << e.what() << "\n";
        return 1;
    }
    return 0;
}